

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

void uECC_vli_modSub(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,uECC_word_t *mod,
                    wordcount_t num_words)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  if (num_words < '\x01') {
    bVar5 = true;
  }
  else {
    uVar2 = 0;
    uVar1 = 0;
    do {
      uVar4 = right[uVar2] + uVar1;
      uVar3 = (ulong)(left[uVar2] < uVar4);
      if (uVar4 == 0) {
        uVar3 = uVar1;
      }
      result[uVar2] = left[uVar2] - uVar4;
      uVar2 = uVar2 + 1;
      uVar1 = uVar3;
    } while ((byte)num_words != uVar2);
    bVar5 = uVar3 == 0;
  }
  if (('\0' < num_words) && (!bVar5)) {
    uVar2 = 0;
    uVar1 = 0;
    do {
      uVar3 = result[uVar2];
      uVar4 = uVar3 + uVar1 + mod[uVar2];
      if (uVar4 != uVar3) {
        uVar1 = (ulong)(uVar4 < uVar3);
      }
      result[uVar2] = uVar4;
      uVar2 = uVar2 + 1;
    } while ((byte)num_words != uVar2);
  }
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_modSub(uECC_word_t *result,
                                  const uECC_word_t *left,
                                  const uECC_word_t *right,
                                  const uECC_word_t *mod,
                                  wordcount_t num_words) {
    uECC_word_t l_borrow = uECC_vli_sub(result, left, right, num_words);
    if (l_borrow) {
        /* In this case, result == -diff == (max int) - diff. Since -x % d == d - x,
           we can get the correct result from result + mod (with overflow). */
        uECC_vli_add(result, result, mod, num_words);
    }
}